

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

void __thiscall SamplerTest_size_of_class_Test::TestBody(SamplerTest_size_of_class_Test *this)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  Sampler sampler;
  SamplerTest_size_of_class_Test *this_local;
  
  sampler._16_8_ = this;
  tcmalloc::Sampler::Sampler((Sampler *)local_28);
  tcmalloc::Sampler::Init((Sampler *)local_28,1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  poVar1 = std::operator<<(poVar1,"Size of Sampler class is: ");
  std::ostream::operator<<(poVar1,0x18);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  poVar1 = std::operator<<(poVar1,"Size of Sampler object is: ");
  std::ostream::operator<<(poVar1,0x18);
  return;
}

Assistant:

TEST_F(SamplerTest, size_of_class) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  LOG(INFO) << "Size of Sampler class is: " << sizeof(tcmalloc::Sampler);
  LOG(INFO) << "Size of Sampler object is: " << sizeof(sampler);
}